

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_wd_add_subtree(lyd_node **root,lyd_node *last_parent,lyd_node *subroot,lys_node *schema,
                      int toplevel,int options,unres_data *unres)

{
  LYS_NODE LVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ly_set *set;
  lys_node *plVar5;
  lys_node *plVar6;
  lyd_node *plVar7;
  lyd_node **pplVar8;
  lys_node *plVar9;
  ulong uVar10;
  lys_node *unaff_RBX;
  long lVar11;
  ly_set *plVar12;
  bool bVar13;
  lyd_node *local_48;
  lyd_node *local_40;
  
  if (((options & 0x10000ffU) != 0) && ((schema->flags & 2) != 0)) {
    return 0;
  }
  plVar9 = (lys_node *)0x0;
  if ((options & 0x8eU) == 0) {
    plVar9 = (lys_node *)(ulong)(2 - (((uint)options >> 0xd & 1) != 0));
  }
  if ((toplevel == 0) ||
     ((schema->nodetype & (LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) == LYS_UNKNOWN)) {
    plVar6 = schema;
    if (subroot == (lyd_node *)0x0) {
      while (unaff_RBX = plVar6->parent, unaff_RBX != (lys_node *)0x0) {
        if ((unaff_RBX->nodetype & (LYS_USES|LYS_CHOICE)) == LYS_UNKNOWN) {
          if ((unaff_RBX->nodetype == LYS_AUGMENT) &&
             (plVar6 = lys_is_disabled(unaff_RBX,0), plVar6 != (lys_node *)0x0)) {
            return 0;
          }
          break;
        }
        plVar5 = lys_is_disabled(unaff_RBX,0);
        plVar6 = unaff_RBX;
        if (plVar5 != (lys_node *)0x0) {
          return 0;
        }
      }
      plVar6 = lys_is_disabled(schema,0);
      if (plVar6 != (lys_node *)0x0) {
        return 0;
      }
    }
    LVar1 = schema->nodetype;
    plVar12 = (ly_set *)0x0;
    set = (ly_set *)0x0;
    local_48 = last_parent;
    local_40 = subroot;
    if ((int)LVar1 < 0x40) {
      set = plVar12;
      switch(LVar1) {
      case LYS_CONTAINER:
        if (subroot == (lyd_node *)0x0) {
          set = (ly_set *)0x0;
          lVar2._0_2_ = schema[1].flags;
          lVar2._2_1_ = schema[1].ext_size;
          lVar2._3_1_ = schema[1].iffeature_size;
          lVar2._4_1_ = schema[1].padding[0];
          lVar2._5_1_ = schema[1].padding[1];
          lVar2._6_1_ = schema[1].padding[2];
          lVar2._7_1_ = schema[1].padding[3];
          if (lVar2 != 0) goto switchD_00171970_caseD_3;
          plVar12 = (ly_set *)0x0;
          local_48 = _lyd_new(last_parent,schema,1);
          local_48->validity = local_48->validity & 0xfb;
          if (unres->store_diff != 0) {
            uVar4 = unres->diff_idx;
            unres->diff_idx = uVar4 + 1;
            iVar3 = lyd_difflist_add(unres->diff,&unres->diff_size,uVar4,LYD_DIFF_CREATED,
                                     (lyd_node *)0x0,local_48);
            set = (ly_set *)0x0;
            if (iVar3 != 0) goto LAB_00171f56;
            unres->store_diff = 0;
            plVar12 = (ly_set *)&DAT_00000001;
          }
          if (last_parent == (lyd_node *)0x0) {
            if (*root == (lyd_node *)0x0) {
              *root = local_48;
            }
            else {
              lyd_insert_common((*root)->parent,root,local_48,0);
            }
          }
          local_40 = local_48;
          if (((options & 0x8eU) == 0) &&
             ((((local_48->field_0x9 & 8) != 0 &&
               (iVar3 = unres_data_add(unres,local_48,UNRES_WHEN), iVar3 == -1)) ||
              (((options & 0x208eU) == 0 &&
               (((uVar4 = resolve_applies_must(local_48), (uVar4 & 1) != 0 &&
                 (iVar3 = unres_data_add(unres,local_48,UNRES_MUST), iVar3 == -1)) ||
                (((uVar4 & 2) != 0 &&
                 (iVar3 = unres_data_add(unres,local_48,UNRES_MUST_INOUT), iVar3 == -1))))))))))
          goto LAB_00171f53;
        }
        else {
LAB_00171b3d:
          lVar11._0_2_ = schema[1].flags;
          lVar11._2_1_ = schema[1].ext_size;
          lVar11._3_1_ = schema[1].iffeature_size;
          lVar11._4_1_ = schema[1].padding[0];
          lVar11._5_1_ = schema[1].padding[1];
          lVar11._6_1_ = schema[1].padding[2];
          lVar11._7_1_ = schema[1].padding[3];
          if (lVar11 == 0) {
            subroot->field_0x9 = subroot->field_0x9 | 1;
          }
        }
        goto LAB_00171b4b;
      case LYS_CHOICE:
        if (toplevel == 0) {
          if (subroot != (lyd_node *)0x0) goto LAB_00171d54;
LAB_00171db1:
          bVar13 = true;
        }
        else {
          if (*root == (lyd_node *)0x0) goto LAB_00171db1;
LAB_00171d54:
          pplVar8 = &subroot->child;
          if (toplevel != 0) {
            pplVar8 = root;
          }
          plVar7 = *pplVar8;
          if (plVar7 == (lyd_node *)0x0) goto LAB_00171db1;
          do {
            plVar6 = lys_parent(plVar7->schema);
            plVar9 = plVar7->schema;
            while (((unaff_RBX = plVar6, unaff_RBX != (lys_node *)0x0 && (unaff_RBX != schema)) &&
                   ((unaff_RBX->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN))) {
              plVar6 = lys_parent(unaff_RBX);
              plVar9 = unaff_RBX;
            }
            bVar13 = unaff_RBX != schema;
          } while ((bVar13) && (plVar7 = plVar7->next, plVar7 != (lyd_node *)0x0));
        }
        if (bVar13) {
          plVar9 = (lys_node *)schema[1].name;
          if (plVar9 == (lys_node *)0x0) goto LAB_00171e1b;
        }
        else if ((unaff_RBX == (lys_node *)0x0) || (plVar9 == (lys_node *)0x0)) {
          __assert_fail("siter && siter_prev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1d59,
                        "int lyd_wd_add_subtree(struct lyd_node **, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int, struct unres_data *)"
                       );
        }
        iVar3 = lyd_wd_add_subtree(root,last_parent,subroot,plVar9,toplevel,options,unres);
        set = (ly_set *)0x0;
        break;
      case LYS_CHOICE|LYS_CONTAINER:
      case LYS_LEAF|LYS_CONTAINER:
      case LYS_LEAF|LYS_CHOICE:
      case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
        goto switchD_00171970_caseD_3;
      case LYS_LEAF:
      case LYS_LEAFLIST:
        if (subroot == (lyd_node *)0x0) {
          set = (ly_set *)0x0;
        }
        else {
          set = ly_set_new();
          if (set == (ly_set *)0x0) goto LAB_00171f53;
          lyd_get_node_siblings(subroot->child,schema,set);
          uVar4 = set->number;
          if ((ulong)uVar4 != 0) {
            if (((subroot->field_0x9 & 1) != 0) && (0 < (int)uVar4)) {
              uVar10 = 0;
              do {
                if (((ulong)(set->set).s[uVar10]->dsc & 0x100) == 0) goto LAB_00171ab4;
                uVar10 = uVar10 + 1;
              } while (uVar4 != uVar10);
            }
            goto switchD_00171970_caseD_3;
          }
        }
        if (schema->nodetype == LYS_LEAF) {
          iVar3 = lyd_wd_add_leaf(root,last_parent,(lys_node_leaf *)schema,unres,(int)plVar9);
          if (iVar3 != 0) {
            return 1;
          }
          goto switchD_00171970_caseD_3;
        }
        iVar3 = lyd_wd_add_leaflist(root,last_parent,(lys_node_leaflist *)schema,unres,(int)plVar9);
        break;
      default:
        if (LVar1 != LYS_LIST) goto switchD_00171970_caseD_3;
        if (subroot != (lyd_node *)0x0) goto LAB_00171b3d;
LAB_00171e1b:
        set = (ly_set *)0x0;
        goto switchD_00171970_caseD_3;
      }
      if (iVar3 == 0) goto switchD_00171970_caseD_3;
      goto LAB_00171f56;
    }
    if ((int)LVar1 < 0x200) {
      plVar12 = set;
      if ((LVar1 != LYS_CASE) && (LVar1 != LYS_NOTIF)) goto switchD_00171970_caseD_3;
    }
    else if ((LVar1 != LYS_INPUT) && ((plVar12 = set, LVar1 != LYS_OUTPUT && (LVar1 != LYS_USES))))
    goto switchD_00171970_caseD_3;
LAB_00171b4b:
    set = ly_set_new();
    if (set != (ly_set *)0x0) {
      plVar9 = schema->child;
      if (plVar9 != (lys_node *)0x0) {
LAB_00171b79:
        if ((plVar9->nodetype & (LYS_USES|LYS_CHOICE)) == LYS_UNKNOWN) {
          if ((plVar9->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) ==
              LYS_UNKNOWN) goto LAB_00171bb1;
          if ((local_40 == (lyd_node *)0x0) ||
             (iVar3 = lyd_get_node_siblings(local_40->child,plVar9,set), iVar3 == 0)) {
            iVar3 = lyd_wd_add_subtree(root,local_48,(lyd_node *)0x0,plVar9,toplevel,options,unres);
            goto joined_r0x00171c5a;
          }
          if ((plVar9->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
            if ((plVar9->nodetype != LYS_LEAF) && (0 < (int)set->number)) {
              lVar11 = 0;
              do {
                iVar3 = lyd_wd_add_subtree(root,(lyd_node *)(set->set).s[lVar11],
                                           (lyd_node *)(set->set).s[lVar11],plVar9,toplevel,options,
                                           unres);
                if (iVar3 != 0) goto LAB_00171f56;
                lVar11 = lVar11 + 1;
              } while (lVar11 < (int)set->number);
            }
          }
          else {
            lyd_wd_leaflist_cleanup(set,unres);
          }
          if (((local_40->field_0x9 & 1) != 0) && (0 < (long)(int)set->number)) {
            lVar11 = 0;
            do {
              plVar7 = local_40;
              if (((ulong)(set->set).s[lVar11]->dsc & 0x100) == 0) goto LAB_00171ca7;
              lVar11 = lVar11 + 1;
            } while ((int)set->number != lVar11);
          }
          goto LAB_00171cbe;
        }
        iVar3 = lyd_wd_add_subtree(root,local_48,local_40,plVar9,toplevel,options,unres);
joined_r0x00171c5a:
        if (iVar3 == 0) goto LAB_00171bb1;
        goto LAB_00171f56;
      }
LAB_00171cca:
      if ((int)plVar12 != 0) {
        unres->store_diff = 1;
      }
switchD_00171970_caseD_3:
      ly_set_free(set);
      return 0;
    }
  }
  else {
    set = ly_set_new();
    if (set != (ly_set *)0x0) {
      if ((*root != (lyd_node *)0x0) &&
         (iVar3 = lyd_get_node_siblings(*root,schema,set), iVar3 != 0)) {
        if (0 < (int)set->number) {
          lVar11 = 0;
          do {
            if ((schema->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
              if ((schema->nodetype != LYS_LEAF) &&
                 (iVar3 = lyd_wd_add_subtree(root,(lyd_node *)(set->set).s[lVar11],
                                             (lyd_node *)(set->set).s[lVar11],schema,0,options,unres
                                            ), iVar3 != 0)) goto LAB_00171f56;
            }
            else {
              lyd_wd_leaflist_cleanup(set,unres);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < (int)set->number);
        }
LAB_00171a70:
        free((set->set).s);
        free(set);
        return 0;
      }
      iVar3 = lyd_wd_add_subtree(root,last_parent,(lyd_node *)0x0,schema,0,options,unres);
      if (iVar3 == 0) goto LAB_00171a70;
      goto LAB_00171f56;
    }
  }
LAB_00171f53:
  set = (ly_set *)0x0;
LAB_00171f56:
  ly_set_free(set);
  return 1;
  while( true ) {
    subroot->field_0x9 = subroot->field_0x9 & 0xfe;
    subroot = subroot->parent;
    if (subroot == (lyd_node *)0x0) break;
LAB_00171ab4:
    if ((subroot->field_0x9 & 1) == 0) break;
  }
  goto switchD_00171970_caseD_3;
  while( true ) {
    plVar7->field_0x9 = plVar7->field_0x9 & 0xfe;
    pplVar8 = &plVar7->parent;
    plVar7 = *pplVar8;
    if (*pplVar8 == (lyd_node *)0x0) break;
LAB_00171ca7:
    if ((plVar7->field_0x9 & 1) == 0) break;
  }
LAB_00171cbe:
  set->number = 0;
LAB_00171bb1:
  plVar9 = plVar9->next;
  if (plVar9 == (lys_node *)0x0) goto LAB_00171cca;
  goto LAB_00171b79;
}

Assistant:

static int
lyd_wd_add_subtree(struct lyd_node **root, struct lyd_node *last_parent, struct lyd_node *subroot,
                   struct lys_node *schema, int toplevel, int options, struct unres_data *unres)
{
    struct ly_set *present = NULL;
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    int i, check_when_must, storing_diff = 0;

    assert(root);

    if ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R)) {
        /* non LYD_OPT_DATA tree, status data are not expected here */
        return EXIT_SUCCESS;
    }

    if (options & (LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        check_when_must = 0; /* check neither */
    } else if (options & LYD_OPT_TRUSTED) {
        check_when_must = 1; /* check only when */
    } else {
        check_when_must = 2; /* check both when and must */
    }

    if (toplevel && (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_CONTAINER))) {
        /* search for the schema node instance */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((*root) && lyd_get_node_siblings(*root, schema, present)) {
            /* there are some instances */
            for (i = 0; i < (signed)present->number; i++) {
                if (schema->nodetype & LYS_LEAFLIST) {
                    lyd_wd_leaflist_cleanup(present, unres);
                } else if (schema->nodetype != LYS_LEAF) {
                    if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], schema, 0, options, unres)) {
                        goto error;
                    }
                } /* else LYS_LEAF - nothing to do */
            }
        } else {
            /* no instance */
            if (lyd_wd_add_subtree(root, last_parent, NULL, schema, 0, options, unres)) {
                goto error;
            }
        }

        ly_set_free(present);
        return EXIT_SUCCESS;
    }

    /* skip disabled parts of schema */
    if (!subroot) {
        /* go through all the uses and check whether they are enabled */
        for (siter = schema->parent; siter && (siter->nodetype & (LYS_USES | LYS_CHOICE)); siter = siter->parent) {
            if (lys_is_disabled(siter, 0)) {
                /* ignore disabled uses nodes */
                return EXIT_SUCCESS;
            }
        }

        /* check augment state */
        if (siter && siter->nodetype == LYS_AUGMENT) {
            if (lys_is_disabled(siter, 0)) {
                /* ignore disabled augment */
                return EXIT_SUCCESS;
            }
        }

        /* check the node itself */
        if (lys_is_disabled(schema, 0)) {
            /* ignore disabled data */
            return EXIT_SUCCESS;
        }
    }

    /* go recursively */
    switch (schema->nodetype) {
    case LYS_LIST:
        if (!subroot) {
            /* stop recursion */
            break;
        }
        /* falls through */
    case LYS_CONTAINER:
        if (!subroot) {
            /* container does not exists, continue only in case of non presence container */
            if (((struct lys_node_container *)schema)->presence) {
                /* stop recursion */
                break;
            }
            /* always create empty NP container even if there is no default node,
             * because accroding to RFC, the empty NP container is always part of
             * accessible tree (e.g. for evaluating when and must conditions) */
            subroot = _lyd_new(last_parent, schema, 1);
            /* useless to set mand flag */
            subroot->validity &= ~LYD_VAL_MAND;

            if (unres->store_diff) {
                /* remember this container in the diff */
                if (unres_data_diff_new(unres, subroot, NULL, 1)) {
                    goto error;
                }

                /* do not store diff for recursive calls, created values will be connected to this one */
                storing_diff = 1;
                unres->store_diff = 0;
            }

            if (!last_parent) {
                if (*root) {
                    lyd_insert_common((*root)->parent, root, subroot, 0);
                } else {
                    *root = subroot;
                }
            }
            last_parent = subroot;

            /* remember the created container in unres */
            if (check_when_must) {
                if ((subroot->when_status & LYD_WHEN) && unres_data_add(unres, subroot, UNRES_WHEN) == -1) {
                    goto error;
                }
                if (check_when_must == 2) {
                    i = resolve_applies_must(subroot);
                    if ((i & 0x1) && (unres_data_add(unres, subroot, UNRES_MUST) == -1)) {
                        goto error;
                    }
                    if ((i & 0x2) && (unres_data_add(unres, subroot, UNRES_MUST_INOUT) == -1)) {
                        goto error;
                    }
                }
            }
        } else if (!((struct lys_node_container *)schema)->presence) {
            /* fix default flag on existing containers - set it on all non-presence containers and in case we will
             * have in recursion function some non-default node, it will unset it */
            subroot->dflt = 1;
        }
        /* falls through */
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:

        /* recursion */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        LY_TREE_FOR(schema->child, siter) {
            if (siter->nodetype & (LYS_CHOICE | LYS_USES)) {
                /* go into without searching for data instance */
                if (lyd_wd_add_subtree(root, last_parent, subroot, siter, toplevel, options, unres)) {
                    goto error;
                }
            } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) {
                /* search for the schema node instance */
                if (subroot && lyd_get_node_siblings(subroot->child, siter, present)) {
                    /* there are some instances in the data root */
                    if (siter->nodetype & LYS_LEAFLIST) {
                        /* already have some leaflists, check that they are all
                         * default, if not, remove the default leaflists */
                        lyd_wd_leaflist_cleanup(present, unres);
                    } else if (siter->nodetype != LYS_LEAF) {
                        /* recursion */
                        for (i = 0; i < (signed)present->number; i++) {
                            if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], siter, toplevel, options,
                                                   unres)) {
                                goto error;
                            }
                        }
                    } /* else LYS_LEAF - nothing to do */

                    /* fix default flag (2nd part) - for non-default node with default parent, unset the default flag
                     * from the parents (starting from subroot node) */
                    if (subroot->dflt) {
                        for (i = 0; i < (signed)present->number; i++) {
                            if (!present->set.d[i]->dflt) {
                                for (iter = subroot; iter && iter->dflt; iter = iter->parent) {
                                    iter->dflt = 0;
                                }
                                break;
                            }
                        }
                    }
                    ly_set_clean(present);
                } else {
                    /* no instance */
                    if (lyd_wd_add_subtree(root, last_parent, NULL, siter, toplevel, options, unres)) {
                        goto error;
                    }
                }
            }
        }

        if (storing_diff) {
            /* continue generating the diff in functions above this one */
            unres->store_diff = 1;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        if (subroot) {
            /* default shortcase of a choice */
            present = ly_set_new();
            if (!present) {
                goto error;
            }
            lyd_get_node_siblings(subroot->child, schema, present);
            if (present->number) {
                /* the shortcase leaf(-list) exists, stop the processing and fix default flags */
                if (subroot->dflt) {
                    for (i = 0; i < (signed)present->number; i++) {
                        if (!present->set.d[i]->dflt) {
                            for (iter = subroot; iter && iter->dflt; iter = iter->parent) {
                                iter->dflt = 0;
                            }
                            break;
                        }
                    }
                }
                break;
            }
        }
        if (schema->nodetype == LYS_LEAF) {
            if (lyd_wd_add_leaf(root, last_parent, (struct lys_node_leaf*)schema, unres, check_when_must)) {
                return EXIT_FAILURE;
            }
        } else { /* LYS_LEAFLIST */
            if (lyd_wd_add_leaflist(root, last_parent, (struct lys_node_leaflist*)schema, unres, check_when_must)) {
                goto error;
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data root from the choice */
        iter = NULL;
        if ((toplevel && (*root)) || (!toplevel && subroot)) {
            LY_TREE_FOR(toplevel ? (*root) : subroot->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_wd_add_subtree(root, last_parent, subroot, ((struct lys_node_choice *)schema)->dflt,
                                       toplevel, options, unres)) {
                    goto error;
                }
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_wd_add_subtree(root, last_parent, subroot, siter_prev, toplevel, options, unres)) {
                goto error;
            }
        }
        break;
    default:
        /* LYS_ANYXML, LYS_ANYDATA, LYS_USES, LYS_GROUPING - do nothing */
        break;
    }

    ly_set_free(present);
    return EXIT_SUCCESS;

error:
    ly_set_free(present);
    return EXIT_FAILURE;
}